

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O1

void __thiscall Balk::add_hard_pinching(Balk *this,int shift,double segment_length)

{
  undefined1 local_41;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  int local_2c;
  shared_ptr<Term> local_28;
  double local_18;
  
  local_40 = (element_type *)0x0;
  local_2c = shift;
  local_18 = segment_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<HardPinching,std::allocator<HardPinching>,int&,double&>
            (&_Stack_38,(HardPinching **)&local_40,(allocator<HardPinching> *)&local_41,&local_2c,
             &local_18);
  local_28.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  local_28.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_38._M_pi;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)&this->terms,
             &local_28);
  if (local_28.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (_Stack_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_38._M_pi);
  }
  return;
}

Assistant:

void Balk::add_hard_pinching(int shift, double segment_length)
{
    terms.push_back(std::make_shared<HardPinching>(shift, segment_length));
}